

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int voctok(voccxdef *ctx,char *cmd,char *outbuf,char **wrd,int lower,int cvt_ones,int show_errors)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  vocwdef *pvVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  byte *pbVar14;
  byte bVar15;
  byte bVar16;
  char *pcVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  byte *pbVar21;
  uint uVar22;
  ushort *puVar23;
  bool bVar24;
  byte *local_60;
  
  uVar22 = 0;
  do {
    bVar16 = *cmd;
    if ((char)bVar16 < '\0') {
      bVar24 = false;
    }
    else {
      ppuVar8 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar8 + (ulong)bVar16 * 2 + 1) & 0x20) == 0) break;
        bVar16 = ((byte *)cmd)[1];
        cmd = (char *)((byte *)cmd + 1);
      } while (-1 < (char)bVar16);
      bVar24 = bVar16 == 0;
    }
    if (bVar24) {
      wrd[(int)uVar22] = outbuf;
      *outbuf = 0;
      return uVar22;
    }
    uVar5 = uVar22 + 1;
    wrd[(int)uVar22] = outbuf;
    bVar16 = *cmd;
    if ((((long)(char)bVar16 < 0) || (ppuVar8 = __ctype_b_loc(), bVar16 == 0x2d)) ||
       (((*ppuVar8)[(char)bVar16] & 0x400) != 0)) {
      uVar12 = (ulong)outbuf & 0xffffffff;
      while( true ) {
        bVar16 = *cmd;
        lVar13 = (long)(char)bVar16;
        iVar7 = (int)uVar12;
        if (((-1 < lVar13) &&
            (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + lVar13 * 2 + 1) & 0xc) == 0)) &&
           ((bVar16 != 0x2d && (bVar16 != 0x27)))) break;
        if (((-1 < (char)bVar16) && (ppuVar8 = __ctype_b_loc(), lower != 0)) &&
           (((*ppuVar8)[lVar13] & 0x100) != 0)) {
          pp_Var9 = __ctype_tolower_loc();
          bVar16 = *(byte *)(*pp_Var9 + lVar13);
        }
        *outbuf = bVar16;
        outbuf = (char *)((byte *)outbuf + 1);
        cmd = (char *)((byte *)cmd + 1);
        uVar12 = (ulong)(iVar7 + 1);
      }
      pcVar17 = wrd[(int)uVar22];
      uVar18 = iVar7 - (int)pcVar17;
      pbVar21 = (byte *)outbuf;
      uVar22 = uVar18;
      local_60 = (byte *)cmd;
      if (bVar16 == 0x2e) {
        local_60 = (byte *)cmd + 1;
        pbVar21 = (byte *)outbuf + 1;
        *outbuf = 0x2e;
        ((byte *)outbuf)[1] = 0;
        uVar22 = (iVar7 - (int)pcVar17) + 1;
        pvVar10 = vocffw(ctx,pcVar17,uVar22,(char *)0x0,0,3,(vocseadef *)0x0);
        if ((pvVar10 == (vocwdef *)0x0) &&
           (pvVar10 = vocffw(ctx,pcVar17,uVar22,(char *)0x0,0,4,(vocseadef *)0x0),
           pvVar10 == (vocwdef *)0x0)) {
          pbVar21 = (byte *)outbuf;
          uVar22 = uVar18;
          local_60 = (byte *)cmd;
        }
      }
      *pbVar21 = 0;
      puVar23 = (ushort *)ctx->voccxcpp;
      iVar7 = ctx->voccxcpl;
      do {
        if (iVar7 == 0) break;
        uVar2 = *puVar23;
        uVar12 = (ulong)uVar2;
        uVar3 = *(ushort *)((long)puVar23 + uVar12);
        lVar13 = uVar3 + uVar12;
        uVar4 = *(ushort *)((long)puVar23 + uVar3 + uVar12);
        if ((((int)uVar5 < 2) || (uVar22 != uVar3 - 2)) ||
           (iVar6 = bcmp(pcVar17,(void *)((long)puVar23 + uVar12 + 2),(ulong)uVar22), iVar6 != 0)) {
LAB_001f580d:
          iVar7 = iVar7 - ((uint)uVar3 + (uint)uVar2 + (uint)uVar4);
          puVar23 = (ushort *)((long)puVar23 + (ulong)uVar4 + lVar13);
          bVar24 = true;
        }
        else {
          pcVar19 = wrd[(ulong)uVar5 - 2];
          sVar11 = strlen(pcVar19);
          if ((sVar11 != uVar2 - 2) ||
             (iVar6 = bcmp(pcVar19,puVar23 + 1,(ulong)(uVar2 - 2)), iVar6 != 0)) goto LAB_001f580d;
          memcpy(pcVar19,(void *)((long)puVar23 + lVar13 + 2),(ulong)(uVar4 - 2));
          wrd[(ulong)uVar5 - 2][(ulong)uVar4 - 2] = '\0';
          uVar5 = uVar5 - 1;
          bVar24 = false;
        }
      } while (bVar24);
      pcVar17 = ctx->voccxspp;
      if (pcVar17 == (char *)0x0) {
        pcVar17 = wrd[(long)(int)uVar5 + -1];
        pcVar20 = &vocsptab[0].vocspout;
        pcVar19 = "of";
        do {
          iVar7 = strncmp(pcVar17,pcVar19,6);
          if ((iVar7 == 0) &&
             (((cvt_ones != 0 || ((*pcVar20 != 'N' && (*pcVar20 != 'P')))) && (*pcVar20 != 'O')))) {
            *pcVar17 = *pcVar20;
            goto LAB_001f59c6;
          }
          pcVar19 = *(char **)(pcVar20 + 8);
          pcVar20 = pcVar20 + 0x10;
        } while (pcVar19 != (char *)0x0);
      }
      else {
        pcVar19 = wrd[(long)(int)uVar5 + -1];
        sVar11 = strlen(pcVar19);
        if (0 < (long)ctx->voccxspl) {
          pcVar20 = pcVar17 + ctx->voccxspl;
LAB_001f58b5:
          iVar7 = (int)pcVar17[1];
          if (iVar7 != (int)sVar11) break;
          cVar1 = *pcVar17;
          iVar6 = bcmp(pcVar17 + 2,pcVar19,(long)iVar7);
          if (iVar6 != 0) break;
          if (cvt_ones == 0) {
            if (0xfc < (byte)(cVar1 + 0xafU)) break;
          }
          else if (cVar1 == 'O') break;
          *pcVar19 = cVar1;
LAB_001f59c6:
          wrd[(long)(int)uVar5 + -1][1] = '\0';
        }
      }
LAB_001f59cd:
      pcVar17 = wrd[(long)(int)uVar5 + -1];
      sVar11 = strlen(pcVar17);
      pbVar21 = (byte *)(pcVar17 + sVar11);
      cmd = (char *)local_60;
      uVar22 = uVar5;
    }
    else {
      pbVar21 = (byte *)outbuf;
      uVar22 = uVar5;
      if (((*ppuVar8)[(char)bVar16] >> 0xb & 1) == 0) {
        if (0x3f < bVar16) {
LAB_001f5a8b:
          if (show_errors != 0) {
            iVar7 = tio_is_html_mode();
            if (iVar7 == 0) {
              vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
            }
            else {
              outformat("\\H-");
              vocerr(ctx,1,"I don\'t understand the punctuation \"%c\".",(ulong)(uint)(int)*cmd);
              outformat("\\H+");
            }
          }
          return -1;
        }
        uVar12 = (ulong)bVar16;
        if ((0x8800400200000000U >> (uVar12 & 0x3f) & 1) == 0) {
          if ((0x8400000000U >> (uVar12 & 0x3f) & 1) != 0) {
            *outbuf = 0x22;
            pbVar21 = (byte *)outbuf + 3;
            pbVar14 = (byte *)cmd + 1;
            bVar15 = ((byte *)cmd)[1];
            if (bVar15 != bVar16 && bVar15 != 0) {
              do {
                cmd = (char *)pbVar14;
                if (bVar15 == 0x5c) {
                  *pbVar21 = 0x5c;
                  pbVar21 = pbVar21 + 1;
                }
                *pbVar21 = bVar15;
                pbVar21 = pbVar21 + 1;
                bVar15 = ((byte *)cmd)[1];
                pbVar14 = (byte *)cmd + 1;
              } while ((bVar15 != 0) && (bVar15 != bVar16));
            }
            *(short *)((byte *)outbuf + 1) = (short)pbVar21 - (short)((byte *)outbuf + 1);
            cmd = (char *)((byte *)cmd + 2);
            if (*pbVar14 != bVar16) {
              cmd = (char *)pbVar14;
            }
            goto LAB_001f5a5e;
          }
          if ((0x400100000000000U >> (uVar12 & 0x3f) & 1) == 0) goto LAB_001f5a8b;
          *outbuf = 0x2c;
        }
        else {
          *outbuf = 0x2e;
        }
        pbVar21 = (byte *)outbuf + 1;
        cmd = (char *)((byte *)cmd + 1);
      }
      else {
        while( true ) {
          bVar16 = *cmd;
          lVar13 = (long)(char)bVar16;
          if (((-1 < lVar13) && ((*(byte *)((long)*ppuVar8 + lVar13 * 2 + 1) & 8) == 0)) &&
             ((((*ppuVar8)[lVar13] >> 10 & 1) == 0 && ((bVar16 != 0x2d && (bVar16 != 0x27))))))
          break;
          cmd = (char *)((byte *)cmd + 1);
          *pbVar21 = bVar16;
          pbVar21 = pbVar21 + 1;
        }
      }
    }
LAB_001f5a5e:
    *pbVar21 = 0;
    outbuf = (char *)(pbVar21 + 1);
  } while( true );
  pcVar17 = pcVar17 + 2 + iVar7;
  if (pcVar20 <= pcVar17) goto LAB_001f59cd;
  goto LAB_001f58b5;
}

Assistant:

int voctok(voccxdef *ctx, char *cmd, char *outbuf, char **wrd,
           int lower, int cvt_ones, int show_errors)
{
    int       i;
    vocspdef *x;
    int       l;
    char     *p;
    char     *w;
    uint      len;

    for (i = 0 ;; )
    {
        while (vocisspace(*cmd)) cmd++;
        if (!*cmd)
        {
            wrd[i] = outbuf;
            *outbuf = '\0';
            return(i);
        }

        wrd[i++] = outbuf;
        if (vocisalpha(*cmd) || *cmd == '-')
        {
            while(vocisalpha(*cmd) || vocisdigit(*cmd) ||
                  *cmd=='\'' || *cmd=='-')
            {
                *outbuf++ = (vocisupper(*cmd) && lower) ? tolower(*cmd) : *cmd;
                ++cmd;
            }
            
            /*
             *   Check for a special case:  abbreviations that end in a
             *   period.  For example, "Mr. Patrick J. Wayne."  We wish
             *   to absorb the period after "Mr" and the one after "J"
             *   into the respective words; we detect this condition by
             *   actually trying to find a word in the dictionary that
             *   has the period.
             */
            w = wrd[i-1];
            len = outbuf - w;
            if (*cmd == '.')
            {
                *outbuf++ = *cmd++;           /* add the period to the word */
                *outbuf = '\0';                        /* null-terminate it */
                ++len;
                if (!vocffw(ctx, (char *)w, len, 0, 0, PRP_NOUN,
                            (vocseadef *)0)
                    && !vocffw(ctx, (char *)w, len, 0, 0, PRP_ADJ,
                               (vocseadef *)0))
                {
                    /* no word with period in dictionary - remove period */
                    --outbuf;
                    --cmd;
                    --len;
                }
            }

            /* null-terminate the buffer */
            *outbuf = '\0';

            /* find compound words and glue them together */
            for (p = ctx->voccxcpp, l = ctx->voccxcpl ; l ; )
            {
                uint   l1 = osrp2(p);
                char  *p2 = p + l1;                      /* get second word */
                uint   l2 = osrp2(p2);
                char  *p3 = p2 + l2;                   /* get compound word */
                uint   l3 = osrp2(p3);
                
                if (i > 1 && len == (l2 - 2)
                    && !memcmp(w, p2 + 2, (size_t)len)
                    && strlen((char *)wrd[i-2]) == (l1 - 2)
                    && !memcmp(wrd[i-2], p + 2, (size_t)(l1 - 2)))
                {
                    memcpy(wrd[i-2], p3 + 2, (size_t)(l3 - 2));
                    *(wrd[i-2] + l3 - 2) = '\0';
                    --i;
                    break;
                }

                /* move on to the next word */
                l -= l1 + l2 + l3;
                p = p3 + l3;
            }

            /*
             *   Find any special keywords, and set to appropriate flag
             *   char.  Note that we no longer convert "of" in this
             *   fashion; "of" is now handled separately in order to
             *   facilitate its use as an ordinary preposition. 
             */
            if (ctx->voccxspp)
            {
                char  *p;
                char  *endp;
                char   typ;
                int    len;
                int    wrdlen = strlen((char *)wrd[i-1]);
                
                for (p = ctx->voccxspp, endp = p + ctx->voccxspl ;
                     p < endp ; )
                {
                    typ = *p++;
                    len = *p++;
                    if (len == wrdlen && !memcmp(p, wrd[i-1], (size_t)len)
                        && (cvt_ones || (typ != VOCW_ONE && typ != VOCW_ONES))
                        && typ != VOCW_OF)
                    {
                        *wrd[i-1] = typ;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                    p += len;
                }
            }
            else
            {
                for (x = vocsptab ; x->vocspin ; ++x)
                {
                    if (!strncmp((char *)wrd[i-1], (char *)x->vocspin,
                                 (size_t)6)
                        && (cvt_ones ||
                            (x->vocspout != VOCW_ONE
                             && x->vocspout != VOCW_ONES))
                        && x->vocspout != VOCW_OF)
                    {
                        *wrd[i-1] = x->vocspout;
                        *(wrd[i-1] + 1) = '\0';
                        break;
                    }
                }
            }

            /* make sure the output pointer is fixed up to the right spot */
            outbuf = wrd[i-1];
            outbuf += strlen((char *)outbuf);
        }
        else if (vocisdigit( *cmd ))
        {
            while(vocisdigit(*cmd) || vocisalpha(*cmd)
                  || *cmd == '\'' || *cmd == '-')
                *outbuf++ = *cmd++;
        }
        else switch( *cmd )
        {
        case '.':
        case '!':
        case '?':
        case ';':
            *outbuf++ = VOCW_THEN;
            ++cmd;
            break;

        case ',':
        case ':':
            *outbuf++ = VOCW_AND;
            ++cmd;
            break;

        case '"':
        case '\'':
            {
                char  *lenptr;
                char   quote = *cmd++;

                /* 
                 *   remember that this is a quoted string (it doesn't
                 *   matter whether they're actually using single or
                 *   double quotes - in either case, we use '"' as the
                 *   flag to indicate that it's a quote string)
                 */
                *outbuf++ = '"';

                /* make room for the length prefix */
                lenptr = outbuf;
                outbuf += 2;

                /* copy up to the matching close quote */
                while (*cmd && *cmd != quote)
                {
                    char c;

                    /* get this character */
                    c = *cmd++;
                    
                    /* escape the character if necessary */
                    switch(c)
                    {
                    case '\\':
                        *outbuf++ = '\\';
                        break;
                    }

                    /* copy this character */
                    *outbuf++ = c;
                }
                
                oswp2(lenptr, ((int)(outbuf - lenptr)));
                if (*cmd == quote) cmd++;
                break;
            }

        default:
            /* display an error if appropriate */
            if (show_errors)
            {
                int hmode = tio_is_html_mode();

                /* 
                 *   if we're in HTML mode, switch out momentarily, so that
                 *   we show the character literally, even if it's a
                 *   markup-significant character (such as '<' or '&') 
                 */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H-");
                
                /* show the message */
                vocerr(ctx, VOCERR(1),
                       "I don't understand the punctuation \"%c\".", *cmd);

                /* restore HTML mode if appropriate */
                if (hmode)
                    tioputs(ctx->voccxtio, "\\H+");
            }

            /* return failure */
            return -1;
        }

        /* null-terminate the result */
        *outbuf++ = '\0';
    }
}